

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void flush_pending(z_streamp strm)

{
  deflate_state *s_00;
  deflate_state *s;
  uint len;
  z_streamp strm_local;
  
  s_00 = strm->state;
  _tr_flush_bits(s_00);
  s._4_4_ = (uInt)s_00->pending;
  if (strm->avail_out < s._4_4_) {
    s._4_4_ = strm->avail_out;
  }
  if (s._4_4_ != 0) {
    memcpy(strm->next_out,s_00->pending_out,(ulong)s._4_4_);
    strm->next_out = strm->next_out + s._4_4_;
    s_00->pending_out = s_00->pending_out + s._4_4_;
    strm->total_out = (ulong)s._4_4_ + strm->total_out;
    strm->avail_out = strm->avail_out - s._4_4_;
    s_00->pending = s_00->pending - (ulong)s._4_4_;
    if (s_00->pending == 0) {
      s_00->pending_out = s_00->pending_buf;
    }
  }
  return;
}

Assistant:

local void flush_pending(z_streamp strm) {
    unsigned len;
    deflate_state *s = strm->state;

    _tr_flush_bits(s);
    len = s->pending;
    if (len > strm->avail_out) len = strm->avail_out;
    if (len == 0) return;

    zmemcpy(strm->next_out, s->pending_out, len);
    strm->next_out  += len;
    s->pending_out  += len;
    strm->total_out += len;
    strm->avail_out -= len;
    s->pending      -= len;
    if (s->pending == 0) {
        s->pending_out = s->pending_buf;
    }
}